

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     scas<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,unsigned_short *eDI,uchar *eAX,Context *context)

{
  bool bVar1;
  type_conflict source;
  unsigned_short uVar2;
  uchar rhs;
  Context *context_local;
  uchar *eAX_local;
  unsigned_short *eDI_local;
  unsigned_short *eCX_local;
  
  bVar1 = repetition_over<unsigned_short,(InstructionSet::x86::Repetition)0>(eCX);
  if (!bVar1) {
    source = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                       (&context->memory,ES,*eDI);
    uVar2 = Flags::direction<unsigned_short>(&context->flags);
    *eDI = *eDI + uVar2;
    sub<false,(InstructionSet::x86::AccessType)0,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (*eAX,source,context);
    repeat<unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (eCX,context);
  }
  return;
}

Assistant:

void scas(
	AddressT &eCX,
	AddressT &eDI,
	IntT &eAX,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	const IntT rhs = context.memory.template access<IntT, AccessType::Read>(Source::ES, eDI);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	Primitive::sub<false, AccessType::Read, IntT>(eAX, rhs, context);

	repeat<AddressT, repetition>(eCX, context);
}